

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pluginmanager.cc
# Opt level: O0

ImportPlugin *
anon_unknown.dwarf_6e144::get_plugin<Typelib::ImportPlugin>
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
           *plugin_map,string *name)

{
  bool bVar1;
  PluginNotFound *this;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  string *name_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
  *plugin_map_local;
  
  it._M_node = (_Base_ptr)name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
       ::find(plugin_map,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
       ::end(plugin_map);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>
             ::operator->(&local_20);
    return ppVar2->second;
  }
  this = (PluginNotFound *)__cxa_allocate_exception(0x10);
  Typelib::PluginNotFound::PluginNotFound(this,(string *)it._M_node);
  __cxa_throw(this,&Typelib::PluginNotFound::typeinfo,Typelib::PluginNotFound::~PluginNotFound);
}

Assistant:

Object* get_plugin( map<string, Object*> const& plugin_map, string const& name)
    {
        typename map<string, Object*>::const_iterator it = plugin_map.find(name);
        if (it == plugin_map.end())
            throw PluginNotFound(name);
        return it->second;
    }